

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O2

uint32_t __thiscall
ddd::DictionarySGL<false,_true>::search_key(DictionarySGL<false,_true> *this,char *key)

{
  bool bVar1;
  Query agent;
  
  agent.pos_ = 0;
  agent.value_ = 0x7fffffff;
  agent.node_pos_ = 0;
  agent.is_finished_ = false;
  agent.key_ = key;
  bVar1 = DaTrie<false,_true,_false>::search_key
                    ((this->trie_)._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl,
                     &agent);
  if (bVar1) {
  }
  else {
    agent.value_ = 0xffffffff;
  }
  return agent.value_;
}

Assistant:

uint32_t search_key(const char* key) const {
    Query agent(key);
    if (!trie_->search_key(agent)) {
      return NOT_FOUND;
    }
    return agent.value();
  }